

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::growGlobalUniformBlock
          (TParseContext *this,TSourceLoc *loc,TType *memberType,TString *memberName,
          TTypeList *typeList)

{
  TIntermediate *this_00;
  uint uVar1;
  int iVar2;
  TBlockStorageClass newBacking;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TQualifier *this_01;
  undefined4 extraout_var_01;
  bool bVar3;
  TQualifier *qualifier;
  TBlockStorageClass storageOverride;
  bool createBlock;
  TTypeList *typeList_local;
  TString *memberName_local;
  TType *memberType_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  bVar3 = (this->super_TParseContextBase).globalUniformBlock == (TVariable *)0x0;
  if (bVar3) {
    uVar1 = TIntermediate::getGlobalUniformBinding
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    (this->super_TParseContextBase).globalUniformBinding = uVar1;
    uVar1 = TIntermediate::getGlobalUniformSet
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    (this->super_TParseContextBase).globalUniformSet = uVar1;
  }
  TParseContextBase::growGlobalUniformBlock
            (&this->super_TParseContextBase,loc,memberType,memberName,typeList);
  if ((0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan) &&
     (((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed & 1U) != 0)) {
    this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar2 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x45])();
    newBacking = TIntermediate::getBlockStorageOverride
                           (this_00,(char *)CONCAT44(extraout_var,iVar2));
    iVar2 = (*(((this->super_TParseContextBase).globalUniformBlock)->super_TSymbol)._vptr_TSymbol
              [0xd])();
    this_01 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x50))();
    *(ulong *)&this_01->field_0x8 = *(ulong *)&this_01->field_0x8 & 0xfffffff7ffffffff | 0x800000000
    ;
    if (newBacking != EbsNone) {
      if (bVar3) {
        TQualifier::setBlockStorage(this_01,newBacking);
        blockQualifierCheck(this,loc,this_01,false);
      }
      iVar2 = (*memberType->_vptr_TType[10])();
      TQualifier::setBlockStorage((TQualifier *)CONCAT44(extraout_var_01,iVar2),newBacking);
    }
  }
  return;
}

Assistant:

void TParseContext::growGlobalUniformBlock(const TSourceLoc& loc, TType& memberType, const TString& memberName, TTypeList* typeList)
{
    bool createBlock = globalUniformBlock == nullptr;

    if (createBlock) {
        globalUniformBinding = intermediate.getGlobalUniformBinding();
        globalUniformSet = intermediate.getGlobalUniformSet();
    }

    // use base class function to create/expand block
    TParseContextBase::growGlobalUniformBlock(loc, memberType, memberName, typeList);

    if (spvVersion.vulkan > 0 && spvVersion.vulkanRelaxed) {
        // check for a block storage override
        TBlockStorageClass storageOverride = intermediate.getBlockStorageOverride(getGlobalUniformBlockName());
        TQualifier& qualifier = globalUniformBlock->getWritableType().getQualifier();
        qualifier.defaultBlock = true;

        if (storageOverride != EbsNone) {
            if (createBlock) {
                // Remap block storage
                qualifier.setBlockStorage(storageOverride);

                // check that the change didn't create errors
                blockQualifierCheck(loc, qualifier, false);
            }

            // remap meber storage as well
            memberType.getQualifier().setBlockStorage(storageOverride);
        }
    }
}